

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void mqtt_client_set_trace(MQTT_CLIENT_HANDLE handle,_Bool traceOn,_Bool rawBytesOn)

{
  _Bool rawBytesOn_local;
  _Bool traceOn_local;
  MQTT_CLIENT_HANDLE handle_local;
  
  if (handle != (MQTT_CLIENT_HANDLE)0x0) {
    if (traceOn) {
      handle->mqtt_flags = handle->mqtt_flags | 1;
    }
    else {
      handle->mqtt_flags = handle->mqtt_flags & 0xfffe;
    }
  }
  return;
}

Assistant:

void mqtt_client_set_trace(MQTT_CLIENT_HANDLE handle, bool traceOn, bool rawBytesOn)
{
    AZURE_UNREFERENCED_PARAMETER(handle);
    AZURE_UNREFERENCED_PARAMETER(traceOn);
    AZURE_UNREFERENCED_PARAMETER(rawBytesOn);
#ifndef NO_LOGGING
    if (handle != NULL)
    {
        if (traceOn)
        {
            handle->mqtt_flags |= MQTT_FLAGS_LOG_TRACE;
        }
        else
        {
            handle->mqtt_flags &= ~MQTT_FLAGS_LOG_TRACE;
        }
#ifdef ENABLE_RAW_TRACE
        if (rawBytesOn)
        {
            handle->mqtt_flags |= MQTT_FLAGS_RAW_TRACE;
        }
        else
        {
            handle->mqtt_flags &= ~MQTT_FLAGS_RAW_TRACE;
        }
#endif
    }
#endif
}